

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexDebug.cpp
# Opt level: O1

HighsDebugStatus
debugDualChuzcFailQuad0
          (HighsOptions *options,HighsInt workCount,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *workData,
          HighsInt numVar,double *workDual,double selectTheta,double remainTheta,bool force)

{
  HighsDebugStatus HVar1;
  ulong uVar2;
  long lVar3;
  HighsLogOptions *log_options_;
  double dVar4;
  double dVar5;
  
  HVar1 = kNotChecked;
  if (1 < (options->super_HighsOptionsStruct).highs_debug_level || force) {
    log_options_ = &(options->super_HighsOptionsStruct).log_options;
    highsLogDev(log_options_,kInfo,"DualChuzC:     No change in loop 2 so return error\n");
    dVar4 = 0.0;
    if (0 < workCount) {
      lVar3 = 0;
      do {
        dVar5 = *(double *)
                 ((long)&((workData->
                          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->second + lVar3);
        dVar4 = dVar4 + dVar5 * dVar5;
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)workCount << 4 != lVar3);
    }
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar5 = 0.0;
    if (0 < numVar) {
      uVar2 = 0;
      do {
        dVar5 = dVar5 + workDual[uVar2] * workDual[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)numVar != uVar2);
    }
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    highsLogDev(log_options_,kInfo,"DualChuzC:     workCount = %d; selectTheta=%g; remainTheta=%g\n"
                ,selectTheta,remainTheta,(ulong)(uint)workCount);
    highsLogDev(log_options_,kInfo,"DualChuzC:     workDataNorm = %g; workDualNorm = %g\n",dVar4,
                dVar5);
    HVar1 = kOk;
  }
  return HVar1;
}

Assistant:

HighsDebugStatus debugDualChuzcFailQuad0(
    const HighsOptions& options, const HighsInt workCount,
    const std::vector<std::pair<HighsInt, double>>& workData,
    const HighsInt numVar, const double* workDual, const double selectTheta,
    const double remainTheta, const bool force) {
  // Non-trivially expensive assessment of CHUZC failure
  if (options.highs_debug_level < kHighsDebugLevelCostly && !force)
    return HighsDebugStatus::kNotChecked;

  highsLogDev(options.log_options, HighsLogType::kInfo,
              "DualChuzC:     No change in loop 2 so return error\n");
  double workDataNorm;
  double workDualNorm;
  debugDualChuzcFailNorms(workCount, workData, workDataNorm, numVar, workDual,
                          workDualNorm);
  highsLogDev(options.log_options, HighsLogType::kInfo,
              "DualChuzC:     workCount = %" HIGHSINT_FORMAT
              "; selectTheta=%g; remainTheta=%g\n",
              workCount, selectTheta, remainTheta);
  highsLogDev(options.log_options, HighsLogType::kInfo,
              "DualChuzC:     workDataNorm = %g; workDualNorm = %g\n",
              workDataNorm, workDualNorm);
  return HighsDebugStatus::kOk;
}